

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManFromIfLogicNode
              (void *pIfMan,Gia_Man_t *pNew,int iObj,Vec_Int_t *vLeaves,Vec_Int_t *vLeavesTemp,
              word *pRes,char *pStr,Vec_Int_t *vCover,Vec_Int_t *vMapping,Vec_Int_t *vMapping2,
              Vec_Int_t *vPacking,int fCheck75,int fCheck44e)

{
  word wVar1;
  word *pwVar2;
  int iVar3;
  int iVar4;
  int Entry;
  int iVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *vLeaves_00;
  word z;
  size_t sVar7;
  uint uVar8;
  word (*pawVar9) [1024];
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  char *pcVar18;
  long lVar19;
  uint nLutLeaf;
  long lVar20;
  bool bVar21;
  word Func0;
  word Func1;
  uint local_bc;
  size_t local_b8;
  ulong local_b0;
  char pLut0 [32];
  word Func2;
  char pLut2 [32];
  char pLut1 [32];
  
  if (fCheck75 != 0) {
    pStr = "54";
  }
  uVar15 = vLeaves->nSize;
  if (fCheck44e == 0) {
    if (uVar15 == 6 && *(int *)(*(long *)((long)pIfMan + 8) + 0x44) != 0) {
      vLeaves_00 = Vec_IntAlloc(4);
      wVar1 = *pRes;
      z = If_Dec6Perform(wVar1,1);
      If_Dec6Verify(wVar1,z);
      pLut0._0_8_ = Abc_Tt6Stretch(z & 0xffff,4);
      vLeaves_00->nSize = 0;
      for (lVar20 = 0x10; lVar20 != 0x20; lVar20 = lVar20 + 4) {
        iVar4 = Vec_IntEntry(vLeaves,(uint)(z >> ((byte)lVar20 & 0x3f)) & 7);
        Vec_IntPush(vLeaves_00,iVar4);
      }
      iVar4 = Gia_ManFromIfLogicCreateLut(pNew,(word *)pLut0,vLeaves_00,vCover,vMapping,vMapping2);
      pLut0._0_8_ = Abc_Tt6Stretch(z >> 0x20 & 0xffff,4);
      vLeaves_00->nSize = 0;
      for (lVar20 = 0x30; lVar20 != 0x40; lVar20 = lVar20 + 4) {
        uVar15 = (uint)(z >> ((byte)lVar20 & 0x3f)) & 7;
        iVar3 = iVar4;
        if (uVar15 != 7) {
          iVar3 = Vec_IntEntry(vLeaves,uVar15);
        }
        Vec_IntPush(vLeaves_00,iVar3);
      }
      iVar4 = Gia_ManFromIfLogicCreateLut(pNew,(word *)pLut0,vLeaves_00,vCover,vMapping,vMapping2);
      Vec_IntFree(vLeaves_00);
      return iVar4;
    }
    if (pStr == (char *)0x0) {
      iVar4 = Gia_ManFromIfLogicCreateLut(pNew,pRes,vLeaves,vCover,vMapping,vMapping2);
      return iVar4;
    }
    sVar7 = strlen(pStr);
    iVar4 = (int)sVar7;
    if (iVar4 - 4U < 0xfffffffe) {
      printf("Wrong LUT struct (%s)\n",pStr);
      return -1;
    }
    uVar11 = 0;
    while ((sVar7 & 0xffffffff) != uVar11) {
      pcVar18 = pStr + uVar11;
      uVar11 = uVar11 + 1;
      if ((byte)(*pcVar18 - 0x37U) < 0xfc) {
        iObj = (int)*pcVar18 - 0x30;
        pcVar18 = "The LUT size (%d) should belong to {3,4,5,6}.\n";
LAB_001f367a:
        printf(pcVar18,(ulong)(uint)iObj);
        return -1;
      }
    }
    uVar17 = 0;
    if (iVar4 == 3) {
      uVar17 = (int)pStr[1] - 0x30;
    }
    iVar3 = uVar17 - 1;
    if (uVar17 == 0) {
      iVar3 = 0;
    }
    if ((int)pStr[iVar4 - 1] + iVar3 + *pStr + -0x61 < (int)uVar15) {
      printf("The node size (%d) is too large for the LUT structure %s.\n",(ulong)uVar15,pStr);
      return -1;
    }
    nLutLeaf = (int)*pStr - 0x30;
    uVar10 = (int)pStr[iVar4 - 1] - 0x30;
    uVar8 = uVar10;
    if ((int)uVar10 < (int)nLutLeaf) {
      uVar8 = nLutLeaf;
    }
    if ((int)uVar8 < (int)uVar17) {
      uVar8 = uVar17;
    }
    if ((int)uVar8 < (int)uVar15) {
      pLut2[0x10] = '\0';
      pLut2[0x11] = '\0';
      pLut2[0x12] = '\0';
      pLut2[0x13] = '\0';
      pLut2[0x14] = '\0';
      pLut2[0x15] = '\0';
      pLut2[0x16] = '\0';
      pLut2[0x17] = '\0';
      pLut2[0x18] = '\0';
      pLut2[0x19] = '\0';
      pLut2[0x1a] = '\0';
      pLut2[0x1b] = '\0';
      pLut2[0x1c] = '\0';
      pLut2[0x1d] = '\0';
      pLut2[0x1e] = '\0';
      pLut2[0x1f] = '\0';
      pLut2[0] = '\0';
      pLut2[1] = '\0';
      pLut2[2] = '\0';
      pLut2[3] = '\0';
      pLut2[4] = '\0';
      pLut2[5] = '\0';
      pLut2[6] = '\0';
      pLut2[7] = '\0';
      pLut2[8] = '\0';
      pLut2[9] = '\0';
      pLut2[10] = '\0';
      pLut2[0xb] = '\0';
      pLut2[0xc] = '\0';
      pLut2[0xd] = '\0';
      pLut2[0xe] = '\0';
      pLut2[0xf] = '\0';
      if (Gia_ManFromIfLogicNode::TruthStore[0][0] == 0) {
        pawVar9 = Gia_ManFromIfLogicNode::TruthStore;
        for (lVar20 = 0; lVar20 != 0x80; lVar20 = lVar20 + 8) {
          *(word (**) [1024])((long)Gia_ManFromIfLogicNode::pTruths + lVar20) = pawVar9;
          pawVar9 = pawVar9 + 1;
        }
        for (lVar20 = 0; lVar20 != 6; lVar20 = lVar20 + 1) {
          wVar1 = Gia_ManFromIfLogicNode::Truth6[lVar20];
          pwVar2 = Gia_ManFromIfLogicNode::pTruths[lVar20];
          for (lVar19 = 0; lVar19 != 0x400; lVar19 = lVar19 + 1) {
            pwVar2[lVar19] = wVar1;
          }
        }
        for (lVar20 = 6; lVar20 != 0x10; lVar20 = lVar20 + 1) {
          pwVar2 = Gia_ManFromIfLogicNode::pTruths[lVar20];
          for (lVar19 = 0; lVar19 != 0x400; lVar19 = lVar19 + 1) {
            pwVar2[lVar19] = -(ulong)((1 << ((char)lVar20 - 6U & 0x1f) & (uint)lVar19) != 0);
          }
        }
      }
      uVar11 = (ulong)(uint)(1 << ((char)uVar15 - 5U & 0x1f));
      uVar12 = uVar11;
      if ((int)uVar15 < 6) {
        uVar11 = 1;
        uVar12 = uVar11;
      }
      do {
        local_bc = uVar17;
        local_b0 = (ulong)uVar10;
        if ((int)uVar11 < 1) {
LAB_001f3785:
          iVar4 = Kit_TruthIsConst1((uint *)pRes,uVar15);
          iVar3 = Vec_IntEntry(vMapping,0);
          if (iVar3 == 0) {
            Vec_IntSetEntry(vMapping,0,vMapping2->nSize);
            Vec_IntPush(vMapping2,0);
            Vec_IntPush(vMapping2,0);
            return iVar4;
          }
          return iVar4;
        }
        lVar20 = uVar11 * 4;
        uVar11 = uVar11 - 1;
      } while (*(int *)((long)pRes + lVar20 + -4) == 0);
      local_b8 = sVar7;
      iVar4 = Kit_TruthIsConst1((uint *)pRes,uVar15);
      if (iVar4 != 0) goto LAB_001f3785;
      uVar16 = 0;
      uVar11 = 0;
      if (0 < (int)uVar15) {
        uVar11 = (ulong)uVar15;
      }
      for (; uVar16 != uVar11; uVar16 = uVar16 + 1) {
        uVar13 = uVar12;
        do {
          if ((int)uVar13 < 1) {
            iVar4 = Vec_IntEntry(vLeaves,(int)uVar16);
            return iVar4;
          }
          lVar20 = uVar13 * 4;
          lVar19 = uVar13 * 4;
          uVar14 = uVar12;
          uVar13 = uVar13 - 1;
        } while (*(int *)((long)pRes + lVar20 + -4) ==
                 *(int *)((long)Gia_ManFromIfLogicNode::pTruths[uVar16] + lVar19 + -4));
        do {
          if ((int)uVar14 < 1) {
            iVar4 = Vec_IntEntry(vLeaves,(int)uVar16);
            iVar4 = Abc_LitNot(iVar4);
            return iVar4;
          }
          lVar20 = uVar14 * 4;
          lVar19 = uVar14 * 4;
          uVar14 = uVar14 - 1;
        } while ((*(uint *)((long)Gia_ManFromIfLogicNode::pTruths[uVar16] + lVar20 + -4) ^
                 *(uint *)((long)pRes + lVar19 + -4)) == 0xffffffff);
      }
      if (fCheck75 == 0) {
        iVar4 = (int)local_b0;
        if ((int)local_b8 == 2) {
LAB_001f3a26:
          iVar4 = If_CluCheckExt((void *)0x0,pRes,uVar15,nLutLeaf,iVar4,pLut0,pLut1,&Func0,&Func1);
        }
        else {
          iVar4 = If_CluCheckExt3(pIfMan,pRes,uVar15,nLutLeaf,local_bc,iVar4,pLut0,pLut1,pLut2,
                                  &Func0,&Func1,&Func2);
        }
        if (iVar4 == 0) {
          Extra_PrintHex(_stdout,(uint *)pRes,uVar15);
          printf("    ");
          Kit_DsdPrintFromTruth((uint *)pRes,uVar15);
          putchar(10);
          pcVar18 = "Node %d is not decomposable. Deriving LUT structures has failed.\n";
          goto LAB_001f367a;
        }
      }
      else if (((7 < (int)uVar15) ||
               (iVar4 = If_CluCheckExt((void *)0x0,pRes,uVar15,4,4,pLut0,pLut1,&Func0,&Func1),
               iVar4 == 0)) &&
              (iVar4 = If_CluCheckExt((void *)0x0,pRes,uVar15,5,4,pLut0,pLut1,&Func0,&Func1),
              iVar4 == 0)) {
        nLutLeaf = 4;
        iVar4 = 5;
        goto LAB_001f3a26;
      }
      vLeavesTemp->nSize = 0;
      for (lVar20 = 0; lVar20 < pLut1[0]; lVar20 = lVar20 + 1) {
        iVar4 = Vec_IntEntry(vLeaves,(int)pLut1[lVar20 + 2]);
        Vec_IntPush(vLeavesTemp,iVar4);
      }
      bVar21 = (int)local_b8 != 3;
      iVar4 = Gia_ManFromIfLogicCreateLut(pNew,&Func1,vLeavesTemp,vCover,vMapping,vMapping2);
      if (pLut2[0] < '\x01' || bVar21) {
        iVar3 = -1;
        Entry = 2;
        iVar5 = iVar4;
      }
      else {
        vLeavesTemp->nSize = 0;
        for (lVar20 = 0; lVar20 < pLut2[0]; lVar20 = lVar20 + 1) {
          iVar3 = iVar4;
          if (uVar15 != (int)pLut2[lVar20 + 2]) {
            iVar3 = Vec_IntEntry(vLeaves,(int)pLut2[lVar20 + 2]);
          }
          Vec_IntPush(vLeavesTemp,iVar3);
        }
        iVar3 = Gia_ManFromIfLogicCreateLut(pNew,&Func2,vLeavesTemp,vCover,vMapping,vMapping2);
        Vec_IntPush(vPacking,3);
        Entry = Abc_Lit2Var(iVar4);
        iVar5 = iVar3;
      }
      Vec_IntPush(vPacking,Entry);
      iVar5 = Abc_Lit2Var(iVar5);
      Vec_IntPush(vPacking,iVar5);
      vLeavesTemp->nSize = 0;
      for (lVar20 = 0; lVar20 < pLut0[0]; lVar20 = lVar20 + 1) {
        uVar17 = (uint)pLut0[lVar20 + 2];
        iVar5 = iVar4;
        if ((uVar15 != uVar17) && (iVar5 = iVar3, uVar15 + 1 != uVar17)) {
          iVar5 = Vec_IntEntry(vLeaves,uVar17);
        }
        Vec_IntPush(vLeavesTemp,iVar5);
      }
      iVar3 = Gia_ManFromIfLogicCreateLut(pNew,&Func0,vLeavesTemp,vCover,vMapping,vMapping2);
      iVar4 = Abc_Lit2Var(iVar3);
      Vec_IntPush(vPacking,iVar4);
    }
    else {
      iVar3 = Gia_ManFromIfLogicCreateLut(pNew,pRes,vLeaves,vCover,vMapping,vMapping2);
      iVar4 = Abc_Lit2Var(iVar3);
      pGVar6 = Gia_ManObj(pNew,iVar4);
      if (iVar3 < 2) {
        return iVar3;
      }
      if (((uint)*(undefined8 *)pGVar6 & 0x9fffffff) == 0x9fffffff) {
        return iVar3;
      }
      Vec_IntPush(vPacking,1);
      iVar4 = Abc_Lit2Var(iVar3);
      Vec_IntPush(vPacking,iVar4);
    }
  }
  else {
    if (4 < (int)uVar15) {
      iVar4 = Gia_ManFromIfLogicCreateLutSpecial
                        (pNew,pRes,vLeaves,vLeavesTemp,vCover,vMapping,vMapping2,vPacking);
      return iVar4;
    }
    iVar3 = Gia_ManFromIfLogicCreateLut(pNew,pRes,vLeaves,vCover,vMapping,vMapping2);
    iVar4 = Abc_Lit2Var(iVar3);
    pGVar6 = Gia_ManObj(pNew,iVar4);
    if (iVar3 < 2) {
      return iVar3;
    }
    if (((uint)*(undefined8 *)pGVar6 & 0x9fffffff) == 0x9fffffff) {
      return iVar3;
    }
    Vec_IntPush(vPacking,1);
    iVar4 = Abc_Lit2Var(iVar3);
    Vec_IntPush(vPacking,iVar4);
  }
  Vec_IntAddToEntry(vPacking,0,1);
  return iVar3;
}

Assistant:

int Gia_ManFromIfLogicNode( void * pIfMan, Gia_Man_t * pNew, int iObj, Vec_Int_t * vLeaves, Vec_Int_t * vLeavesTemp, 
    word * pRes, char * pStr, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2, Vec_Int_t * vPacking, int fCheck75, int fCheck44e )
{
    int nLeaves = Vec_IntSize(vLeaves);
    int i, Length, nLutLeaf, nLutLeaf2, nLutRoot, iObjLit1, iObjLit2, iObjLit3;
    // workaround for the special case
    if ( fCheck75 )
        pStr = "54";
    // perform special case matching for 44
    if ( fCheck44e )
    {
        if ( Vec_IntSize(vLeaves) <= 4 )
        {
            // create mapping
            iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, pRes, vLeaves, vCover, vMapping, vMapping2 );
            // write packing
            if ( !Gia_ObjIsCi(Gia_ManObj(pNew, Abc_Lit2Var(iObjLit1))) && iObjLit1 > 1 )
            {
                Vec_IntPush( vPacking, 1 );
                Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit1) );
                Vec_IntAddToEntry( vPacking, 0, 1 );
            }
            return iObjLit1;
        }
        return Gia_ManFromIfLogicCreateLutSpecial( pNew, pRes, vLeaves, vLeavesTemp, vCover, vMapping, vMapping2, vPacking );
    }
    if ( ((If_Man_t *)pIfMan)->pPars->fLut6Filter && Vec_IntSize(vLeaves) == 6 )
    {
        extern word If_Dec6Perform( word t, int fDerive );
        extern void If_Dec6Verify( word t, word z );
        Vec_Int_t * vLeaves2 = Vec_IntAlloc( 4 );
        word t = pRes[0];
        word z = If_Dec6Perform( t, 1 );
        //If_DecPrintConfig( z );
        If_Dec6Verify( t, z );

        t = Abc_Tt6Stretch( z & 0xffff, 4 );
        Vec_IntClear( vLeaves2 );
        for ( i = 0; i < 4; i++ )
            Vec_IntPush( vLeaves2, Vec_IntEntry( vLeaves, (int)((z >> (16+i*4)) & 7) ) );
        iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, &t, vLeaves2, vCover, vMapping, vMapping2 );

        t = Abc_Tt6Stretch( (z >> 32) & 0xffff, 4 );
        Vec_IntClear( vLeaves2 );
        for ( i = 0; i < 4; i++ )
            if ( ((z >> (48+i*4)) & 7) == 7 )
                Vec_IntPush( vLeaves2, iObjLit1 );
            else
                Vec_IntPush( vLeaves2, Vec_IntEntry( vLeaves, (int)((z >> (48+i*4)) & 7) ) );
        iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, &t, vLeaves2, vCover, vMapping, vMapping2 );

        Vec_IntFree( vLeaves2 );
        return iObjLit1;
    }
    // check if there is no LUT structures
    if ( pStr == NULL )
        return Gia_ManFromIfLogicCreateLut( pNew, pRes, vLeaves, vCover, vMapping, vMapping2 );
    // quit if parameters are wrong
    Length = strlen(pStr);
    if ( Length != 2 && Length != 3 )
    {
        printf( "Wrong LUT struct (%s)\n", pStr );
        return -1;
    }
    for ( i = 0; i < Length; i++ )
        if ( pStr[i] - '0' < 3 || pStr[i] - '0' > 6 )
        {
            printf( "The LUT size (%d) should belong to {3,4,5,6}.\n", pStr[i] - '0' );
            return -1;
        }

    nLutLeaf  =                   pStr[0] - '0';
    nLutLeaf2 = ( Length == 3 ) ? pStr[1] - '0' : 0;
    nLutRoot  =                   pStr[Length-1] - '0';
    if ( nLeaves > nLutLeaf - 1 + (nLutLeaf2 ? nLutLeaf2 - 1 : 0) + nLutRoot )
    {
        printf( "The node size (%d) is too large for the LUT structure %s.\n", nLeaves, pStr );
        return -1;
    }

    // consider easy case
    if ( nLeaves <= Abc_MaxInt( nLutLeaf2, Abc_MaxInt(nLutLeaf, nLutRoot) ) )
    {
        // create mapping
        iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, pRes, vLeaves, vCover, vMapping, vMapping2 );
        // write packing
        if ( !Gia_ObjIsCi(Gia_ManObj(pNew, Abc_Lit2Var(iObjLit1))) && iObjLit1 > 1 )
        {
            Vec_IntPush( vPacking, 1 );
            Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit1) );
            Vec_IntAddToEntry( vPacking, 0, 1 );
        }
        return iObjLit1;
    }
    else
    {
        extern int If_CluMinimumBase( word * t, int * pSupp, int nVarsAll, int * pnVars );

        static word TruthStore[16][1<<10] = {{0}}, * pTruths[16];
        word Func0, Func1, Func2;
        char pLut0[32], pLut1[32], pLut2[32] = {0};

        if ( TruthStore[0][0] == 0 )
        {
            static word Truth6[6] = {
                0xAAAAAAAAAAAAAAAA,
                0xCCCCCCCCCCCCCCCC,
                0xF0F0F0F0F0F0F0F0,
                0xFF00FF00FF00FF00,
                0xFFFF0000FFFF0000,
                0xFFFFFFFF00000000
            };
            int nVarsMax = 16;
            int nWordsMax = (1 << 10);
            int i, k;
            assert( nVarsMax <= 16 );
            for ( i = 0; i < nVarsMax; i++ )
                pTruths[i] = TruthStore[i];
            for ( i = 0; i < 6; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = Truth6[i];
            for ( i = 6; i < nVarsMax; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = ((k >> (i-6)) & 1) ? ~(word)0 : 0;
        }
        // derive truth table
        if ( Kit_TruthIsConst0((unsigned *)pRes, nLeaves) || Kit_TruthIsConst1((unsigned *)pRes, nLeaves) )
        {
//            fprintf( pFile, ".names %s\n %d\n", Abc_ObjName(Abc_ObjFanout0(pObj)), Kit_TruthIsConst1((unsigned *)pRes, nLeaves) );
            iObjLit1 = Abc_LitNotCond( 0, Kit_TruthIsConst1((unsigned *)pRes, nLeaves) );
            // write mapping
            if ( Vec_IntEntry(vMapping, 0) == 0 )
            {
                Vec_IntSetEntry( vMapping, 0, Vec_IntSize(vMapping2) );
                Vec_IntPush( vMapping2, 0 );
                Vec_IntPush( vMapping2, 0 );
            }
            return iObjLit1;
        }
        // check for elementary truth table
        for ( i = 0; i < nLeaves; i++ )
        {
            if ( Kit_TruthIsEqual((unsigned *)pRes, (unsigned *)pTruths[i], nLeaves) )
                return Vec_IntEntry(vLeaves, i);
            if ( Kit_TruthIsOpposite((unsigned *)pRes, (unsigned *)pTruths[i], nLeaves) )
                return Abc_LitNot(Vec_IntEntry(vLeaves, i));
        }

        // perform decomposition
        if ( fCheck75 ) 
        {
//            if ( nLeaves < 8 && If_CutPerformCheck16( p, (unsigned *)pTruth, nVars, nLeaves, "44" ) )
            if ( nLeaves < 8 && If_CluCheckExt( NULL, pRes, nLeaves, 4, 4, pLut0, pLut1, &Func0, &Func1 ) )
            {
                nLutLeaf = 4;
                nLutRoot = 4;
            }
//            if ( If_CutPerformCheck45( p, (unsigned *)pTruth, nVars, nLeaves, pStr ) )
            else if ( If_CluCheckExt( NULL, pRes, nLeaves, 5, 4, pLut0, pLut1, &Func0, &Func1 ) )
            {
                nLutLeaf = 5;
                nLutRoot = 4;
            }
//            if ( If_CutPerformCheck54( p, (unsigned *)pTruth, nVars, nLeaves, pStr ) )
            else if ( If_CluCheckExt( NULL, pRes, nLeaves, 4, 5, pLut0, pLut1, &Func0, &Func1 ) )
            {
                nLutLeaf = 4;
                nLutRoot = 5;
            }
            else
            {
                Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                printf( "Node %d is not decomposable. Deriving LUT structures has failed.\n", iObj );
                return -1;
            }
        }
        else
        {
            if ( Length == 2 )
            {
                if ( !If_CluCheckExt( NULL, pRes, nLeaves, nLutLeaf, nLutRoot, pLut0, pLut1, &Func0, &Func1 ) )
                {
                    Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                    Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                    printf( "Node %d is not decomposable. Deriving LUT structures has failed.\n", iObj );
                    return -1;
                }
            }
            else
            {
                if ( !If_CluCheckExt3( pIfMan, pRes, nLeaves, nLutLeaf, nLutLeaf2, nLutRoot, pLut0, pLut1, pLut2, &Func0, &Func1, &Func2 ) )
                {
                    Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                    Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                    printf( "Node %d is not decomposable. Deriving LUT structures has failed.\n", iObj );
                    return -1;
                }
            }
        }

/*
        // write leaf node
        Id = Abc2_NtkAllocObj( pNew, pLut1[0], Abc2_ObjType(pObj) );
        iObjLit1 = Abc_Var2Lit( Id, 0 );
        pObjNew = Abc2_NtkObj( pNew, Id );
        for ( i = 0; i < pLut1[0]; i++ )
            Abc2_ObjSetFaninLit( pObjNew, i, Abc2_ObjFaninCopy(pObj, pLut1[2+i]) );
        Abc2_ObjSetTruth( pObjNew, Func1 );
*/
        // write leaf node
        Vec_IntClear( vLeavesTemp );
        for ( i = 0; i < pLut1[0]; i++ )
            Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, pLut1[2+i]) );
        iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, &Func1, vLeavesTemp, vCover, vMapping, vMapping2 );

        if ( Length == 3 && pLut2[0] > 0 )
        {
        /*
            Id = Abc2_NtkAllocObj( pNew, pLut2[0], Abc2_ObjType(pObj) );
            iObjLit2 = Abc_Var2Lit( Id, 0 );
            pObjNew = Abc2_NtkObj( pNew, Id );
            for ( i = 0; i < pLut2[0]; i++ )
                if ( pLut2[2+i] == nLeaves )
                    Abc2_ObjSetFaninLit( pObjNew, i, iObjLit1 );
                else
                    Abc2_ObjSetFaninLit( pObjNew, i, Abc2_ObjFaninCopy(pObj, pLut2[2+i]) );
            Abc2_ObjSetTruth( pObjNew, Func2 );
        */

            // write leaf node
            Vec_IntClear( vLeavesTemp );
            for ( i = 0; i < pLut2[0]; i++ )
                if ( pLut2[2+i] == nLeaves )
                    Vec_IntPush( vLeavesTemp, iObjLit1 );
                else
                    Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, pLut2[2+i]) );
            iObjLit2 = Gia_ManFromIfLogicCreateLut( pNew, &Func2, vLeavesTemp, vCover, vMapping, vMapping2 );

            // write packing
            Vec_IntPush( vPacking, 3 );
            Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit1) );
            Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit2) );
        }
        else
        {
            // write packing
            Vec_IntPush( vPacking, 2 );
            Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit1) );
            iObjLit2 = -1;
        }
/*
        // write root node
        Id = Abc2_NtkAllocObj( pNew, pLut0[0], Abc2_ObjType(pObj) );
        iObjLit3 = Abc_Var2Lit( Id, 0 );
        pObjNew = Abc2_NtkObj( pNew, Id );
        for ( i = 0; i < pLut0[0]; i++ )
            if ( pLut0[2+i] == nLeaves )
                Abc2_ObjSetFaninLit( pObjNew, i, iObjLit1 );
            else if ( pLut0[2+i] == nLeaves+1 )
                Abc2_ObjSetFaninLit( pObjNew, i, iObjLit2 );
            else
                Abc2_ObjSetFaninLit( pObjNew, i, Abc2_ObjFaninCopy(pObj, pLut0[2+i]) );
        Abc2_ObjSetTruth( pObjNew, Func0 );
        Abc2_ObjSetCopy( pObj, iObjLit3 );
*/
        // write root node
        Vec_IntClear( vLeavesTemp );
        for ( i = 0; i < pLut0[0]; i++ )
            if ( pLut0[2+i] == nLeaves )
                Vec_IntPush( vLeavesTemp, iObjLit1 );
            else if ( pLut0[2+i] == nLeaves+1 )
                Vec_IntPush( vLeavesTemp, iObjLit2 );
            else
                Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, pLut0[2+i]) );
        iObjLit3 = Gia_ManFromIfLogicCreateLut( pNew, &Func0, vLeavesTemp, vCover, vMapping, vMapping2 );

        // write packing
        Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit3) );
        Vec_IntAddToEntry( vPacking, 0, 1 );
    }
    return iObjLit3;
}